

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>_> *this,void **vtt,
          TPZGeoBlend<pzgeom::TPZGeoPoint> *geo,int matind,TPZGeoMesh *mesh)

{
  void *pvVar1;
  
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,vtt + 1,matind,mesh);
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(&(this->fGeo).super_TPZGeoPoint + -4) + *(long *)((long)pvVar1 + -0x60)) =
       vtt[3];
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPoint>::TPZGeoBlend(&this->fGeo,geo);
  this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZGeoElSideIndex_0187bb90;
  this->fNeighbours[0].fGeoElIndex = -1;
  this->fNeighbours[0].fSide = -1;
  (this->fGeo).fGeoEl = &this->super_TPZGeoEl;
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TGeo &geo,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(geo) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}